

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraint::FindImplicitConflicts
          (cmOrderDirectoriesConstraint *this,ostringstream *w)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  ostream *poVar5;
  byte local_a1;
  string local_88;
  byte local_61;
  string local_60;
  string *local_40;
  string *dir;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool first;
  ostringstream *w_local;
  cmOrderDirectoriesConstraint *this_local;
  
  bVar1 = true;
  this_00 = &this->OD->OriginalDirectories;
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  dir = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&dir), bVar2) {
    local_40 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    bVar3 = std::operator!=(local_40,&this->Directory);
    local_61 = 0;
    bVar2 = false;
    local_a1 = 0;
    if (bVar3) {
      cmsys::SystemTools::GetRealPath(&local_60,local_40,(string *)0x0);
      local_61 = 1;
      cmsys::SystemTools::GetRealPath(&local_88,&this->Directory,(string *)0x0);
      bVar2 = true;
      bVar3 = std::operator!=(&local_60,&local_88);
      local_a1 = 0;
      if (bVar3) {
        iVar4 = (*this->_vptr_cmOrderDirectoriesConstraint[3])(this,local_40);
        local_a1 = (byte)iVar4;
      }
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_88);
    }
    if ((local_61 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_60);
    }
    if ((local_a1 & 1) != 0) {
      if (bVar1) {
        bVar1 = false;
        std::operator<<((ostream *)w,"  ");
        (*this->_vptr_cmOrderDirectoriesConstraint[2])(this,w);
        poVar5 = std::operator<<((ostream *)w," in ");
        poVar5 = std::operator<<(poVar5,(string *)&this->Directory);
        std::operator<<(poVar5," may be hidden by files in:\n");
      }
      poVar5 = std::operator<<((ostream *)w,"    ");
      poVar5 = std::operator<<(poVar5,(string *)local_40);
      std::operator<<(poVar5,"\n");
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void FindImplicitConflicts(std::ostringstream& w)
  {
    bool first = true;
    for (std::string const& dir : this->OD->OriginalDirectories) {
      // Check if this directory conflicts with the entry.
      if (dir != this->Directory &&
          cmSystemTools::GetRealPath(dir) !=
            cmSystemTools::GetRealPath(this->Directory) &&
          this->FindConflict(dir)) {
        // The library will be found in this directory but it is
        // supposed to be found in an implicit search directory.
        if (first) {
          first = false;
          w << "  ";
          this->Report(w);
          w << " in " << this->Directory << " may be hidden by files in:\n";
        }
        w << "    " << dir << "\n";
      }
    }
  }